

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O2

void __thiscall
Imf_2_5::TypedDeepImageChannel<float>::setSamplesToZero
          (TypedDeepImageChannel<float> *this,size_t i,uint oldNumSamples,uint newNumSamples)

{
  float **ppfVar1;
  uint j;
  ulong uVar2;
  
  ppfVar1 = this->_sampleListPointers;
  for (uVar2 = (ulong)oldNumSamples; uVar2 < newNumSamples; uVar2 = uVar2 + 1) {
    ppfVar1[i][uVar2] = 0.0;
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::setSamplesToZero
    (size_t i,
     unsigned int oldNumSamples,
     unsigned int newNumSamples)
{
    //
    // Expand the size of a sample list for a single pixel and
    // set the new samples in the list to 0.
    //
    // i                The position of the affected pixel in
    //                  the channel's _sampleListPointers.
    //
    // oldNumSamples    Original number of samples in the sample list.
    //
    // newNumSamples    New number of samples in the sample list.
    //

    for (unsigned int j = oldNumSamples; j < newNumSamples; ++j)
        _sampleListPointers[i][j] = 0;
}